

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::pls_decl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,PlsRemap *var)

{
  uint32_t uVar1;
  SPIRVariable *variable_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  string local_1e8 [32];
  string local_1c8 [32];
  char *local_1a8;
  char *local_1a0 [3];
  BaseType local_184;
  undefined1 local_180 [4];
  uint32_t vecsize;
  SPIRType type;
  pair<spv::Op,_spirv_cross::SPIRType::BaseType> op_and_basetype;
  SPIRVariable *variable;
  PlsRemap *var_local;
  CompilerGLSL *this_local;
  
  variable_00 = Compiler::get<spirv_cross::SPIRVariable>(&this->super_Compiler,var->id);
  type.member_name_cache._M_h._M_single_bucket =
       (__node_base_ptr)pls_format_to_basetype(var->format);
  SPIRType::SPIRType((SPIRType *)local_180,(Op)type.member_name_cache._M_h._M_single_bucket);
  type.super_IVariant.self.id = type.member_name_cache._M_h._M_single_bucket._4_4_;
  local_184 = pls_format_to_components(var->format);
  if (Void < local_184) {
    type.super_IVariant._vptr_IVariant._4_4_ = 0x17;
    type.basetype = local_184;
  }
  local_1a0[0] = to_pls_layout(var->format);
  local_1a8 = to_pls_qualifiers_glsl(this,variable_00);
  (*(this->super_Compiler)._vptr_Compiler[0x13])(local_1c8,this,local_180,0);
  uVar1 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(variable_00->super_IVariant).self);
  (*(this->super_Compiler)._vptr_Compiler[6])(local_1e8,this,(ulong)uVar1,1);
  join<char_const*,char_const*,std::__cxx11::string,char_const(&)[2],std::__cxx11::string>
            (__return_storage_ptr__,(spirv_cross *)local_1a0,&local_1a8,(char **)local_1c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4921b2,
             (char (*) [2])local_1e8,in_stack_fffffffffffffdd8);
  ::std::__cxx11::string::~string(local_1e8);
  ::std::__cxx11::string::~string(local_1c8);
  SPIRType::~SPIRType((SPIRType *)local_180);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::pls_decl(const PlsRemap &var)
{
	auto &variable = get<SPIRVariable>(var.id);

	auto op_and_basetype = pls_format_to_basetype(var.format);

	SPIRType type { op_and_basetype.first };
	type.basetype = op_and_basetype.second;
	auto vecsize = pls_format_to_components(var.format);
	if (vecsize > 1)
	{
		type.op = OpTypeVector;
		type.vecsize = vecsize;
	}

	return join(to_pls_layout(var.format), to_pls_qualifiers_glsl(variable), type_to_glsl(type), " ",
	            to_name(variable.self));
}